

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackGenerator::DisplayVerboseOutput(cmCPackGenerator *this,char *msg,float progress)

{
  cmCPackLog *this_00;
  long *msg_00;
  size_t sVar1;
  ostringstream cmCPackLog_msg;
  undefined1 auStack_1b8 [8];
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  if (msg == (char *)0x0) {
    std::ios::clear((int)(auStack_1b8 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) + 0x28);
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,msg,sVar1);
  }
  std::ios::widen((char)(ostringstream *)local_190 + (char)*(_func_int **)(local_190._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_190);
  std::ostream::flush();
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  msg_00 = local_1b0;
  sVar1 = strlen((char *)local_1b0);
  cmCPackLog::Log(this_00,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3d,(char *)msg_00,sVar1);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmCPackGenerator::DisplayVerboseOutput(const char* msg,
  float progress)
{
  (void)progress;
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "" << msg << std::endl);
}